

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int CRYPTO_pkcs7_unpad(uint *unpadded_buflen_p,uchar *buf,uint blocksize)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  
  uVar5 = 0;
  if (0xffffff00 < blocksize - 0x100) {
    pbVar2 = buf + ((ulong)blocksize - 1);
    bVar1 = *pbVar2;
    uVar3 = 0;
    bVar4 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 | ((uint)uVar3 ^ (uint)bVar1) - 1 >> 0x18;
      bVar4 = bVar4 | ~(byte)uVar5 & (*pbVar2 ^ bVar1);
      uVar3 = uVar3 + 1;
      pbVar2 = pbVar2 + -1;
    } while (blocksize != uVar3);
    *unpadded_buflen_p = blocksize - bVar1;
    uVar5 = (uint)(bVar1 <= blocksize && bVar4 == 0);
  }
  return uVar5;
}

Assistant:

int CRYPTO_pkcs7_unpad(unsigned int *unpadded_buflen_p, unsigned char *buf, unsigned int blocksize)
{
    const unsigned char       *tail;
    unsigned char              mask = 0U;
    unsigned char              c;
    unsigned char              invalid = 0U;
    unsigned int               i;
    unsigned char              pad;

    if (blocksize <= 0U || blocksize >= 256U)
        return GML_ERROR;

    tail = &buf[blocksize - 1U];
    pad = *tail;

    for (i = 0U; i < blocksize; i++) {
        c = *(tail - i);
        mask |= (unsigned char) (((i ^ (unsigned int) pad) - 1U) >> ((sizeof(unsigned int) - 1) * 8));
        invalid |= (c ^ pad) & (~mask);
    }
    *unpadded_buflen_p = blocksize - (unsigned int) pad;

    return (int)(invalid == 0U && pad <= blocksize);
}